

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O0

void fast_gmm_free(fast_gmm_t *fg)

{
  fast_gmm_t *fg_local;
  
  if (fg != (fast_gmm_t *)0x0) {
    if (fg->gmms->ci_occu != (int32 *)0x0) {
      ckd_free(fg->gmms->ci_occu);
    }
    if (fg->gmms->idx != (int32 *)0x0) {
      ckd_free(fg->gmms->idx);
    }
    if (fg->gmms != (gmm_select_t *)0x0) {
      ckd_free(fg->gmms);
    }
    if (fg->gaus != (gau_select_t *)0x0) {
      ckd_free(fg->gaus);
    }
    if (fg->downs != (downsampling_t *)0x0) {
      ckd_free(fg->downs);
    }
    ckd_free(fg);
  }
  return;
}

Assistant:

void
fast_gmm_free(fast_gmm_t * fg)
{
    if (fg) {
        if (fg->gmms->ci_occu)
            ckd_free(fg->gmms->ci_occu);
        if (fg->gmms->idx)
            ckd_free(fg->gmms->idx);

        if (fg->gmms)
            ckd_free(fg->gmms);

        if (fg->gaus)
            ckd_free(fg->gaus);

        if (fg->downs)
            ckd_free(fg->downs);

        ckd_free(fg);
    }
}